

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_rust.cpp
# Opt level: O0

string * __thiscall
flatbuffers::rust::RustGenerator::WrapInNameSpace
          (string *__return_storage_ptr__,RustGenerator *this,Namespace *ns,string *name)

{
  int iVar1;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined1 local_48 [8];
  string prefix;
  string *name_local;
  Namespace *ns_local;
  RustGenerator *this_local;
  
  prefix.field_2._8_8_ = name;
  iVar1 = (*(this->super_BaseGenerator)._vptr_BaseGenerator[3])();
  if ((Namespace *)CONCAT44(extraout_var,iVar1) == ns) {
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)prefix.field_2._8_8_);
  }
  else {
    iVar1 = (*(this->super_BaseGenerator)._vptr_BaseGenerator[3])();
    GetRelativeNamespaceTraversal_abi_cxx11_
              ((string *)local_48,this,(Namespace *)CONCAT44(extraout_var_00,iVar1),ns);
    std::operator+(__return_storage_ptr__,(string *)local_48,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   prefix.field_2._8_8_);
    std::__cxx11::string::~string((string *)local_48);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string WrapInNameSpace(const Namespace *ns,
                              const std::string &name) const {
    if (CurrentNameSpace() == ns) return name;
    std::string prefix = GetRelativeNamespaceTraversal(CurrentNameSpace(), ns);
    return prefix + name;
  }